

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b64decode.cpp
# Opt level: O3

int __thiscall base64::Decoder::decode(Decoder *this,char value_in)

{
  int iVar1;
  
  iVar1 = -1;
  if (0xaf < (byte)(value_in + 0x85U)) {
    iVar1 = (int)base64_decode_value::decoding[(byte)value_in - 0x2b];
  }
  return iVar1;
}

Assistant:

int base64_decode_value(signed char value_in)
{
  static const signed char decoding[] = {62, -1, -1, -1, 63, 52, 53, 54, 55, 56, 57, 58, 59, 60, 61, -1, -1, -1, -2, -1, -1,
    -1, 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, -1, -1, -1, -1,
    -1, -1, 26, 27, 28, 29, 30, 31, 32, 33, 34, 35, 36, 37, 38, 39, 40, 41, 42, 43, 44, 45, 46, 47, 48, 49, 50, 51};
  static const int decoding_size = sizeof(decoding);
  int index = int(value_in) - 43;
  if (index < 0 || index >= decoding_size)
    return -1;
  return decoding[index];
}